

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

string * __thiscall
font2svg::glyph::typography_box_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int y2;
  int y1;
  int x2;
  int x1;
  allocator<char> local_39;
  string local_38 [32];
  glyph *local_18;
  glyph *this_local;
  
  local_18 = this;
  this_local = (glyph *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::__cxx11::stringstream::str((string *)&this->tmp);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::operator<<((ostream *)&this->field_0x270,"\n\n  <!-- draw bearing + advance box --> ");
  iVar1 = (int)(this->gm).horiAdvance;
  iVar2 = -(int)(this->gm).height - (int)(this->gm).vertBearingY;
  iVar3 = iVar2 + (int)(this->gm).vertAdvance;
  poVar4 = std::operator<<((ostream *)&this->field_0x270,
                           "\n <path stroke=\'blue\' fill=\'none\' stroke-dasharray=\'10,16\' d=\'")
  ;
  poVar4 = std::operator<<(poVar4," M");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4," M");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4," L");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4," L");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4," L");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::operator<<(poVar4," \'/>");
  std::__cxx11::stringstream::str();
  return __return_storage_ptr__;
}

Assistant:

std::string typography_box()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw bearing + advance box --> ";
		int x1 = 0;
		int x2 = gm.horiAdvance;
		int y1 = -gm.vertBearingY-gm.height;
		int y2 = y1 + gm.vertAdvance;
		tmp << "\n <path stroke='blue' fill='none' stroke-dasharray='10,16' d='"
			<< " M" << x1 << "," << y1
			<< " M" << x1 << "," << y2
			<< " L" << x2 << "," << y2
			<< " L" << x2 << "," << y1
			<< " L" << x1 << "," << y1
			<< " '/>";

		return tmp.str();
	}